

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_base.h
# Opt level: O1

void __thiscall
fructose::test_base<TestAdsPerformance>::add_test
          (test_base<TestAdsPerformance> *this,string *name,test_case the_test)

{
  string *psVar1;
  pointer pcVar2;
  iterator iVar3;
  ostream *poVar4;
  mapped_type *pmVar5;
  size_type in_RCX;
  stringstream str;
  undefined1 *local_208;
  undefined8 local_200;
  undefined1 local_1f8 [8];
  pointer pbStack_1f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1e8;
  undefined1 local_1d0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0;
  undefined1 local_1b0 [24];
  pointer local_198;
  pointer pbStack_190;
  ios_base local_150 [264];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  if ((this->m_exceptionPending)._M_string_length == 0) {
    iVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<void_(TestAdsPerformance::*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_fructose::test_root::test_info>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<void_(TestAdsPerformance::*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_fructose::test_root::test_info>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<void_(TestAdsPerformance::*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_fructose::test_root::test_info>_>_>_>
            ::find(&(this->m_tests)._M_t,name);
    if ((_Rb_tree_header *)iVar3._M_node == &(this->m_tests)._M_t._M_impl.super__Rb_tree_header) {
      pcVar2 = (name->_M_dataplus)._M_p;
      local_208 = local_1f8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_208,pcVar2,pcVar2 + name->_M_string_length);
      local_1c0._M_allocated_capacity = (size_type)(local_1d0 + 0x20);
      if (local_208 == local_1f8) {
        local_1b0._8_8_ = pbStack_1f0;
      }
      else {
        local_1c0._M_allocated_capacity = (size_type)local_208;
      }
      local_1c0._8_8_ = local_200;
      local_200 = 0;
      local_1f8[0] = 0;
      local_1b0._16_8_ = (pointer)0x0;
      local_198 = (pointer)0x0;
      pbStack_190 = (pointer)0x0;
      local_1e8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_1e8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1e8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_208 = local_1f8;
      local_1d0._0_8_ = the_test;
      local_1d0._8_8_ = in_RCX;
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<void_(TestAdsPerformance::*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_fructose::test_root::test_info>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<void_(TestAdsPerformance::*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_fructose::test_root::test_info>_>_>_>
               ::operator[](&this->m_tests,name);
      psVar1 = (string *)(local_1d0 + 0x10);
      pmVar5->first = local_1d0._0_8_;
      *(undefined8 *)&pmVar5->field_0x8 = local_1d0._8_8_;
      std::__cxx11::string::operator=((string *)&pmVar5->second,psVar1);
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pmVar5->second).m_arguments.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pmVar5->second).m_arguments.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pmVar5->second).m_arguments.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (pmVar5->second).m_arguments.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_1b0._16_8_;
      (pmVar5->second).m_arguments.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = local_198;
      (pmVar5->second).m_arguments.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pbStack_190;
      local_1b0._16_8_ = (pointer)0x0;
      local_198 = (pointer)0x0;
      pbStack_190 = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_48);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_1d0 + 0x30));
      if ((undefined1 *)local_1c0._M_allocated_capacity != local_1d0 + 0x20) {
        operator_delete((void *)local_1c0._M_allocated_capacity);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_1e8);
      if (local_208 != local_1f8) {
        operator_delete(local_208);
      }
      pcVar2 = (name->_M_dataplus)._M_p;
      local_1d0._0_8_ = psVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1d0,pcVar2,pcVar2 + name->_M_string_length);
      local_1b0._0_8_ = (pointer)0x0;
      local_1b0._8_8_ = (pointer)0x0;
      local_1b0._16_8_ = (pointer)0x0;
      std::vector<fructose::test_root::test_info,_std::allocator<fructose::test_root::test_info>_>::
      emplace_back<fructose::test_root::test_info>(&this->m_available_tests,(test_info *)local_1d0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_1d0 + 0x20));
      if ((string *)local_1d0._0_8_ != psVar1) {
        operator_delete((void *)local_1d0._0_8_);
      }
    }
    else {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1d0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1d0 + 0x10),"add_test called with test name \'",0x20);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)(local_1d0 + 0x10),(name->_M_dataplus)._M_p,
                          name->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,"\' which has already been added.",0x1f);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)&this->m_exceptionPending,(string *)&local_208);
      if (local_208 != local_1f8) {
        operator_delete(local_208);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1d0);
      std::ios_base::~ios_base(local_150);
    }
  }
  return;
}

Assistant:

inline void 
test_base<test_container>::add_test(const std::string& name, 
                                    test_case the_test)
{
    if (m_exceptionPending.length() > 0)
    {
        return;
    }

    typename std::map<std::string, std::pair<test_case, test_info> >::const_iterator it = m_tests.find(name);
    if (it == m_tests.end())
    {
        m_tests[name] = std::make_pair(the_test, test_info(name));
        m_available_tests.push_back(name);
    }
    else
    {
        std::stringstream str;
        str << "add_test called with test name '" << name
            << "' which has already been added.";
        m_exceptionPending = str.str();
    }
}